

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase80::run(TestCase80 *this)

{
  int *piVar1;
  int *piVar2;
  int *local_38;
  int *local_30;
  Arena arena;
  
  Arena::Arena(&arena,0x400);
  piVar1 = Arena::allocate<int>(&arena);
  piVar2 = Arena::allocate<int>(&arena);
  if ((piVar1 + 1 != piVar2) && (_::Debug::minSeverity < 3)) {
    local_38 = piVar2;
    local_30 = piVar1 + 1;
    _::Debug::log<char_const(&)[36],int*,int*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"(&i1 + 1) == (&i2)\", &i1 + 1, &i2",
               (char (*) [36])"failed: expected (&i1 + 1) == (&i2)",&local_30,&local_38);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, TrivialObject) {
  Arena arena;

  int& i1 = arena.allocate<int>();
  int& i2 = arena.allocate<int>();

  // Trivial objects should be tightly-packed.
  EXPECT_EQ(&i1 + 1, &i2);
}